

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::SubdivMeshNode> *mesh,ssize_t id)

{
  bool bVar1;
  size_t sVar2;
  int in_EDX;
  int __oflag;
  int __oflag_00;
  long *in_RSI;
  XMLWriter *in_RDI;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *__range1_1;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p;
  iterator __end1;
  iterator __begin1;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *__range1;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_00000200;
  XMLWriter *in_stack_00000208;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffffd98;
  avector<Vec3fa> *in_stack_fffffffffffffda0;
  allocator *paVar3;
  allocator *in_stack_fffffffffffffda8;
  XMLWriter *in_stack_fffffffffffffdb0;
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [32];
  reference local_1b8;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *local_1b0;
  __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
  local_1a8;
  long local_1a0;
  undefined1 local_191 [40];
  allocator local_169;
  string local_168 [32];
  reference local_148;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *local_140;
  __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
  local_138;
  long local_130;
  allocator local_121;
  string local_120 [32];
  long *local_100 [3];
  allocator local_e1;
  string local_e0 [32];
  int local_c0;
  long *local_a8;
  long **local_a0;
  long **local_98;
  
  local_c0 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"SubdivisionMesh",&local_e1);
  open(in_RDI,(char *)local_e0,local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  local_a8 = (long *)(*in_RSI + 0x1a0);
  local_a0 = local_100;
  local_100[0] = (long *)*local_a8;
  if (local_100[0] != (long *)0x0) {
    (**(code **)(*local_100[0] + 0x10))();
  }
  store(in_stack_00000208,in_stack_00000200);
  local_98 = local_100;
  if (local_100[0] != (long *)0x0) {
    (**(code **)(*local_100[0] + 0x18))();
  }
  sVar2 = SceneGraph::SubdivMeshNode::numTimeSteps((SubdivMeshNode *)0x3fc95a);
  if (sVar2 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"animated_positions",&local_121);
    open(in_RDI,(char *)local_120,__oflag);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
  }
  local_130 = *in_RSI + 0x70;
  local_138._M_current =
       (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
       std::
       vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
       ::begin(in_stack_fffffffffffffd98);
  local_140 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::end(in_stack_fffffffffffffd98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                        *)in_stack_fffffffffffffda0,
                       (__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                        *)in_stack_fffffffffffffd98);
    if (!bVar1) break;
    local_148 = __gnu_cxx::
                __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                ::operator*(&local_138);
    store(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    __gnu_cxx::
    __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
    ::operator++(&local_138);
  }
  sVar2 = SceneGraph::SubdivMeshNode::numTimeSteps((SubdivMeshNode *)0x3fcb72);
  if (sVar2 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"animated_positions",&local_169);
    close(in_RDI,(int)local_168);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  sVar2 = SceneGraph::SubdivMeshNode::numTimeSteps((SubdivMeshNode *)0x3fcc3f);
  if (sVar2 != 1) {
    in_stack_fffffffffffffdb0 = (XMLWriter *)local_191;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_191 + 1),"animated_normals",(allocator *)in_stack_fffffffffffffdb0);
    open(in_RDI,local_191 + 1,__oflag_00);
    std::__cxx11::string::~string((string *)(local_191 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_191);
  }
  local_1a0 = *in_RSI + 0x88;
  local_1a8._M_current =
       (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
       std::
       vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
       ::begin(in_stack_fffffffffffffd98);
  local_1b0 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::end(in_stack_fffffffffffffd98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                        *)in_stack_fffffffffffffda0,
                       (__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                        *)in_stack_fffffffffffffd98);
    if (!bVar1) break;
    local_1b8 = __gnu_cxx::
                __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                ::operator*(&local_1a8);
    store(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    __gnu_cxx::
    __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
    ::operator++(&local_1a8);
  }
  sVar2 = SceneGraph::SubdivMeshNode::numTimeSteps((SubdivMeshNode *)0x3fcdb4);
  if (sVar2 != 1) {
    in_stack_fffffffffffffda8 = &local_1d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"animated_normals",in_stack_fffffffffffffda8);
    close(in_RDI,(int)local_1d8);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  }
  store<embree::Vec2<float>>
            (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
             (vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
             in_stack_fffffffffffffda0);
  store<unsigned_int>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffffda0);
  store<unsigned_int>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffffda0);
  store<unsigned_int>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffffda0);
  store<unsigned_int>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffffda0);
  store<unsigned_int>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffffda0);
  store<embree::Vec2<int>>
            (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
             (vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)
             in_stack_fffffffffffffda0);
  store<float>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffda0);
  store<unsigned_int>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffffda0);
  store<float>(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffda0);
  paVar3 = &local_201;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"SubdivisionMesh",paVar3);
  close(in_RDI,(int)local_200);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::SubdivMeshNode> mesh, ssize_t id)
  {
    open("SubdivisionMesh",id);
    store(mesh->material);
    
    if (mesh->numTimeSteps() != 1) open("animated_positions");
    for (const auto& p : mesh->positions) store("positions",p);
    if (mesh->numTimeSteps() != 1) close("animated_positions");

    if (mesh->numTimeSteps() != 1) open("animated_normals");
    for (const auto& p : mesh->normals) store("normals",p);
    if (mesh->numTimeSteps() != 1) close("animated_normals");

    store("texcoords",mesh->texcoords);
    store("position_indices",mesh->position_indices);
    store("normal_indices",mesh->normal_indices);
    store("texcoord_indices",mesh->texcoord_indices);
    store("faces",mesh->verticesPerFace);
    store("holes",mesh->holes);
    store("edge_creases",mesh->edge_creases);
    store("edge_crease_weights",mesh->edge_crease_weights);
    store("vertex_creases",mesh->vertex_creases);
    store("vertex_crease_weights",mesh->vertex_crease_weights);
    close("SubdivisionMesh");
  }